

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver.cc
# Opt level: O1

StatusOr<google::protobuf::FeatureSet> * __thiscall
google::protobuf::FeatureResolver::MergeFeatures
          (StatusOr<google::protobuf::FeatureSet> *__return_storage_ptr__,FeatureResolver *this,
          FeatureSet *merged_parent,FeatureSet *unmerged_child)

{
  Status _status;
  FeatureSet merged;
  Status local_78;
  FeatureSet local_70;
  
  FeatureSet::FeatureSet(&local_70,(Arena *)0x0,&this->defaults_);
  FeatureSet::MergeImpl((MessageLite *)&local_70,(MessageLite *)merged_parent);
  FeatureSet::MergeImpl((MessageLite *)&local_70,(MessageLite *)unmerged_child);
  anon_unknown_21::ValidateMergedFeatures((anon_unknown_21 *)&local_78,&local_70);
  if (local_78.rep_ == 1) {
    FeatureSet::FeatureSet
              (&(__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>).field_1.
                data_,(Arena *)0x0,&local_70);
    (__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>).field_0 =
         (anon_union_8_1_1246618d_for_StatusOrData<google::protobuf::FeatureSet>_1)0x1;
  }
  else {
    absl::lts_20250127::internal_statusor::StatusOrData<google::protobuf::FeatureSet>::
    StatusOrData<const_absl::lts_20250127::Status,_0>
              (&__return_storage_ptr__->super_StatusOrData<google::protobuf::FeatureSet>,&local_78);
    absl::lts_20250127::Status::~Status(&local_78);
  }
  FeatureSet::~FeatureSet(&local_70);
  return __return_storage_ptr__;
}

Assistant:

absl::StatusOr<FeatureSet> FeatureResolver::MergeFeatures(
    const FeatureSet& merged_parent, const FeatureSet& unmerged_child) const {
  FeatureSet merged = defaults_;
  merged.MergeFrom(merged_parent);
  merged.MergeFrom(unmerged_child);

  RETURN_IF_ERROR(ValidateMergedFeatures(merged));

  return merged;
}